

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.h
# Opt level: O0

void __thiscall QTextTableCellFormat::~QTextTableCellFormat(QTextTableCellFormat *this)

{
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7c18a2);
  return;
}

Assistant:

class Q_GUI_EXPORT QTextTableCellFormat : public QTextCharFormat
{
public:
    QTextTableCellFormat();

    inline bool isValid() const { return isTableCellFormat(); }

    inline void setTopPadding(qreal padding);
    inline qreal topPadding() const;

    inline void setBottomPadding(qreal padding);
    inline qreal bottomPadding() const;

    inline void setLeftPadding(qreal padding);
    inline qreal leftPadding() const;

    inline void setRightPadding(qreal padding);
    inline qreal rightPadding() const;

    inline void setPadding(qreal padding);

    inline void setTopBorder(qreal width)
    { setProperty(TableCellTopBorder, width); }
    inline qreal topBorder() const
    { return doubleProperty(TableCellTopBorder); }

    inline void setBottomBorder(qreal width)
    { setProperty(TableCellBottomBorder, width); }
    inline qreal bottomBorder() const
    { return doubleProperty(TableCellBottomBorder); }

    inline void setLeftBorder(qreal width)
    { setProperty(TableCellLeftBorder, width); }
    inline qreal leftBorder() const
    { return doubleProperty(TableCellLeftBorder); }

    inline void setRightBorder(qreal width)
    { setProperty(TableCellRightBorder, width); }
    inline qreal rightBorder() const
    { return doubleProperty(TableCellRightBorder); }

    inline void setBorder(qreal width);

    inline void setTopBorderStyle(QTextFrameFormat::BorderStyle style)
    { setProperty(TableCellTopBorderStyle, style); }
    inline QTextFrameFormat::BorderStyle topBorderStyle() const
    { return static_cast<QTextFrameFormat::BorderStyle>(intProperty(TableCellTopBorderStyle)); }

    inline void setBottomBorderStyle(QTextFrameFormat::BorderStyle style)
    { setProperty(TableCellBottomBorderStyle, style); }
    inline QTextFrameFormat::BorderStyle bottomBorderStyle() const
    { return static_cast<QTextFrameFormat::BorderStyle>(intProperty(TableCellBottomBorderStyle)); }

    inline void setLeftBorderStyle(QTextFrameFormat::BorderStyle style)
    { setProperty(TableCellLeftBorderStyle, style); }
    inline QTextFrameFormat::BorderStyle leftBorderStyle() const
    { return static_cast<QTextFrameFormat::BorderStyle>(intProperty(TableCellLeftBorderStyle)); }

    inline void setRightBorderStyle(QTextFrameFormat::BorderStyle style)
    { setProperty(TableCellRightBorderStyle, style); }
    inline QTextFrameFormat::BorderStyle rightBorderStyle() const
    { return static_cast<QTextFrameFormat::BorderStyle>(intProperty(TableCellRightBorderStyle)); }

    inline void setBorderStyle(QTextFrameFormat::BorderStyle style);

    inline void setTopBorderBrush(const QBrush &brush)
    { setProperty(TableCellTopBorderBrush, brush); }
    inline QBrush topBorderBrush() const
    { return brushProperty(TableCellTopBorderBrush); }

    inline void setBottomBorderBrush(const QBrush &brush)
    { setProperty(TableCellBottomBorderBrush, brush); }
    inline QBrush bottomBorderBrush() const
    { return brushProperty(TableCellBottomBorderBrush); }

    inline void setLeftBorderBrush(const QBrush &brush)
    { setProperty(TableCellLeftBorderBrush, brush); }
    inline QBrush leftBorderBrush() const
    { return brushProperty(TableCellLeftBorderBrush); }

    inline void setRightBorderBrush(const QBrush &brush)
    { setProperty(TableCellRightBorderBrush, brush); }
    inline QBrush rightBorderBrush() const
    { return brushProperty(TableCellRightBorderBrush); }

    inline void setBorderBrush(const QBrush &brush);

protected:
    explicit QTextTableCellFormat(const QTextFormat &fmt);
    friend Q_GUI_EXPORT QDataStream &operator<<(QDataStream &, const QTextTableCellFormat &);
    friend Q_GUI_EXPORT QDataStream &operator>>(QDataStream &, QTextTableCellFormat &);
    friend class QTextFormat;
}